

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process_thread_impl.cc
# Opt level: O0

void __thiscall dd::ProcessThreadImpl::~ProcessThreadImpl(ProcessThreadImpl *this)

{
  bool bVar1;
  pointer pPVar2;
  const_reference pvVar3;
  reference ppQVar4;
  ProcessThreadImpl *this_local;
  
  (this->super_ProcessThread).super_TaskQueueBase._vptr_TaskQueueBase =
       (_func_int **)&PTR_Delete_001c0a78;
  bVar1 = SequenceCheckerImpl::IsCurrent((SequenceCheckerImpl *)&this->_thread_checker);
  if (!bVar1) {
    __assert_fail("_thread_checker.IsCurrent()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/boss-li[P]quick/thread/process_thread_impl.cc"
                  ,0x1a,"virtual dd::ProcessThreadImpl::~ProcessThreadImpl()");
  }
  pPVar2 = std::unique_ptr<dd::PlatformThread,_std::default_delete<dd::PlatformThread>_>::get
                     (&this->_thread);
  if (pPVar2 == (pointer)0x0) {
    if (((this->_stop ^ 0xffU) & 1) != 0) {
      while (bVar1 = std::
                     priority_queue<dd::ProcessThreadImpl::DelayedTask,_std::vector<dd::ProcessThreadImpl::DelayedTask,_std::allocator<dd::ProcessThreadImpl::DelayedTask>_>,_std::less<dd::ProcessThreadImpl::DelayedTask>_>
                     ::empty(&this->_delayed_tasks), ((bVar1 ^ 0xffU) & 1) != 0) {
        pvVar3 = std::
                 priority_queue<dd::ProcessThreadImpl::DelayedTask,_std::vector<dd::ProcessThreadImpl::DelayedTask,_std::allocator<dd::ProcessThreadImpl::DelayedTask>_>,_std::less<dd::ProcessThreadImpl::DelayedTask>_>
                 ::top(&this->_delayed_tasks);
        if (pvVar3->task != (QueuedTask *)0x0) {
          (*pvVar3->task->_vptr_QueuedTask[1])();
        }
        std::
        priority_queue<dd::ProcessThreadImpl::DelayedTask,_std::vector<dd::ProcessThreadImpl::DelayedTask,_std::allocator<dd::ProcessThreadImpl::DelayedTask>_>,_std::less<dd::ProcessThreadImpl::DelayedTask>_>
        ::pop(&this->_delayed_tasks);
      }
      while (bVar1 = std::
                     queue<dd::QueuedTask_*,_std::deque<dd::QueuedTask_*,_std::allocator<dd::QueuedTask_*>_>_>
                     ::empty(&this->_queue), ((bVar1 ^ 0xffU) & 1) != 0) {
        ppQVar4 = std::
                  queue<dd::QueuedTask_*,_std::deque<dd::QueuedTask_*,_std::allocator<dd::QueuedTask_*>_>_>
                  ::front(&this->_queue);
        if (*ppQVar4 != (value_type)0x0) {
          (*(*ppQVar4)->_vptr_QueuedTask[1])();
        }
        std::
        queue<dd::QueuedTask_*,_std::deque<dd::QueuedTask_*,_std::allocator<dd::QueuedTask_*>_>_>::
        pop(&this->_queue);
      }
      std::
      priority_queue<dd::ProcessThreadImpl::DelayedTask,_std::vector<dd::ProcessThreadImpl::DelayedTask,_std::allocator<dd::ProcessThreadImpl::DelayedTask>_>,_std::less<dd::ProcessThreadImpl::DelayedTask>_>
      ::~priority_queue(&this->_delayed_tasks);
      std::queue<dd::QueuedTask_*,_std::deque<dd::QueuedTask_*,_std::allocator<dd::QueuedTask_*>_>_>
      ::~queue(&this->_queue);
      std::__cxx11::
      list<dd::ProcessThreadImpl::ModuleCallback,_std::allocator<dd::ProcessThreadImpl::ModuleCallback>_>
      ::~list(&this->_modules);
      std::unique_ptr<dd::PlatformThread,_std::default_delete<dd::PlatformThread>_>::~unique_ptr
                (&this->_thread);
      Event::~Event(&this->_wake_up);
      ThreadChecker::~ThreadChecker(&this->_thread_checker);
      Lock::~Lock(&this->_lock);
      ProcessThread::~ProcessThread(&this->super_ProcessThread);
      return;
    }
    __assert_fail("!_stop",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/boss-li[P]quick/thread/process_thread_impl.cc"
                  ,0x1c,"virtual dd::ProcessThreadImpl::~ProcessThreadImpl()");
  }
  __assert_fail("!_thread.get()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/boss-li[P]quick/thread/process_thread_impl.cc"
                ,0x1b,"virtual dd::ProcessThreadImpl::~ProcessThreadImpl()");
}

Assistant:

ProcessThreadImpl::~ProcessThreadImpl() {
		assert(_thread_checker.IsCurrent());
		assert(!_thread.get());
		assert(!_stop);
		while (!_delayed_tasks.empty()) {
			delete _delayed_tasks.top().task;
			_delayed_tasks.pop();
		}

		while (!_queue.empty()) {
			delete _queue.front();
			_queue.pop();
		}
	}